

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Ptr_t * Gia_ManMiterNames(Vec_Ptr_t *p,int nOuts)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  int i;
  int i_00;
  char pBuffer [1000];
  
  p_00 = Vec_PtrAlloc(nOuts / -2 + p->nSize);
  if ((nOuts & 1U) != 0) {
    __assert_fail("nOuts % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb57,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  iVar1 = p->nSize;
  if (iVar1 < nOuts) {
    __assert_fail("nOuts <= Vec_PtrSize(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xb58,"Vec_Ptr_t *Gia_ManMiterNames(Vec_Ptr_t *, int)");
  }
  for (i = 0; i_00 = i, i + 1 < iVar1; i = i + 2) {
    pvVar2 = Vec_PtrEntry(p,i);
    pvVar3 = Vec_PtrEntry(p,i + 1);
    i_00 = nOuts;
    if (nOuts == i) break;
    sprintf(pBuffer,"%s_xor_%s",pvVar2,pvVar3);
    pcVar4 = Abc_UtilStrsav(pBuffer);
    Vec_PtrPush(p_00,pcVar4);
    iVar1 = p->nSize;
  }
  for (; i_00 < p->nSize; i_00 = i_00 + 1) {
    pcVar4 = (char *)Vec_PtrEntry(p,i_00);
    pcVar4 = Abc_UtilStrsav(pcVar4);
    Vec_PtrPush(p_00,pcVar4);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Gia_ManMiterNames( Vec_Ptr_t * p, int nOuts )
{
    char * pName1, * pName2, pBuffer[1000]; int i;
    Vec_Ptr_t * pNew = Vec_PtrAlloc( Vec_PtrSize(p) - nOuts/2 );
    assert( nOuts % 2 == 0 );
    assert( nOuts <= Vec_PtrSize(p) );
    Vec_PtrForEachEntryDouble( char *, char *, p, pName1, pName2, i )
    {
        if ( i == nOuts )
            break;
        sprintf( pBuffer, "%s_xor_%s", pName1, pName2 );
        Vec_PtrPush( pNew, Abc_UtilStrsav(pBuffer) );
    }
    Vec_PtrForEachEntryStart( char *, p, pName1, i, i )
        Vec_PtrPush( pNew, Abc_UtilStrsav(pName1) );
    return pNew;
}